

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  table *ptVar2;
  char *pcVar3;
  unit *unaff_retaddr;
  char *np;
  int t;
  int f;
  int i;
  int c;
  table *lp;
  table *tp;
  char *cp;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_20;
  int local_1c;
  table *local_18;
  table *local_10;
  char *local_8;
  
  local_8 = names;
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    *local_8 = '*';
    local_8[1] = (char)local_20 + 'a';
    local_8[2] = '*';
    local_8[3] = '\0';
    ptVar2 = hash((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    ptVar2->name = local_8;
    ptVar2->factor = 1.0;
    ptVar2->dim[local_20] = '\x01';
    local_8 = local_8 + 4;
  }
  local_18 = hash((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_18->name = local_8 + -1;
  local_18->factor = 1.0;
  pcVar3 = local_8;
LAB_00122e46:
  do {
    do {
      while( true ) {
        local_8 = pcVar3;
        pcVar1 = local_8;
        local_1c = get();
        if (local_1c == 0) {
          if (dumpflg != 0) {
            for (local_10 = table; local_10 < &state; local_10 = local_10 + 1) {
              if (local_10->name != (char *)0x0) {
                printf("%s",local_10->name);
                units((unit *)0x122eb2);
              }
            }
          }
          fclose((FILE *)inpfile);
          inpfile = _stdin;
          return (int)_stdin;
        }
        pcVar3 = local_8;
        if (local_1c != 0x2f) break;
        local_1c = 0x2f;
        while (local_1c != 10 && local_1c != 0) {
          local_1c = get();
        }
      }
    } while (local_1c == 10);
    do {
      local_8 = pcVar3;
      if (local_1c == 0x20 || local_1c == 9) {
        pcVar3 = local_8 + 1;
        *local_8 = '\0';
        local_18 = hash((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        local_8 = pcVar3;
        if (local_18->name != (char *)0x0) goto LAB_00123159;
        convr(unaff_retaddr);
        local_18->name = pcVar1;
        in_stack_ffffffffffffffdc = 0;
        if ((local_18->factor != 1.0) || (NAN(local_18->factor))) goto LAB_00122e46;
        local_1c = 0;
        goto LAB_001230bf;
      }
      pcVar3 = local_8 + 1;
      *local_8 = (char)local_1c;
      local_1c = get();
      if (local_1c == 0) goto LAB_00122e46;
    } while (local_1c != 10);
    local_8 = local_8 + 2;
    *pcVar3 = '\0';
    ptVar2 = hash((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (ptVar2->name == (char *)0x0) {
      ptVar2->name = pcVar1;
      ptVar2->factor = local_18->factor;
      for (local_1c = 0; pcVar3 = local_8, local_1c < 10; local_1c = local_1c + 1) {
        ptVar2->dim[local_1c] = local_18->dim[local_1c];
      }
    }
    else {
LAB_00123159:
      printf("redefinition %s\n",pcVar1);
      pcVar3 = local_8;
    }
  } while( true );
LAB_001230bf:
  if (9 < local_1c) goto LAB_00123133;
  in_stack_ffffffffffffffd8 = (int)local_18->dim[local_1c];
  if ((1 < in_stack_ffffffffffffffd8) ||
     ((0 < in_stack_ffffffffffffffdc && (in_stack_ffffffffffffffd8 != 0)))) goto LAB_00122e46;
  if ((in_stack_ffffffffffffffdc == 0) && (in_stack_ffffffffffffffd8 == 1)) {
    if (unames[local_1c] != (char *)0x0) goto LAB_00122e46;
    in_stack_ffffffffffffffdc = local_1c + 1;
  }
  local_1c = local_1c + 1;
  goto LAB_001230bf;
LAB_00123133:
  if (0 < in_stack_ffffffffffffffdc) {
    unames[in_stack_ffffffffffffffdc + -1] = pcVar1;
  }
  goto LAB_00122e46;
}

Assistant:

static void init()
{
	register char *cp;
	register struct table *tp, *lp;
	int c, i, f, t;
	char *np;

	cp = names;
	for(i=0; i<NDIM; i++) {
		np = cp;
		*cp++ = '*';
		*cp++ = i+'a';
		*cp++ = '*';
		*cp++ = 0;
		lp = hash(np);
		lp->name = np;
		lp->factor = 1.0;
		lp->dim[i] = 1;
	}
	lp = hash("");
	lp->name = cp-1;
	lp->factor = 1.0;

l0:
	c = get();
	if(c == 0) {
#if 0
		printf("%d units; %d bytes\n\n", i, cp-names);
#endif
		if(dumpflg)
		for(tp = table; tp < table+NTAB; tp++) {
			if(tp->name == 0)
				continue;
			printf("%s", tp->name);
			units((struct unit *)tp);
		}
		fclose(inpfile);
		inpfile = stdin;
		return;
	}
	if(c == '/') {
		while(c != '\n' && c != 0)
			c = get();
		goto l0;
	}
	if(c == '\n')
		goto l0;
	np = cp;
	while(c != ' ' && c != '\t') {
		*cp++ = c;
		c = get();
		if (c==0)
			goto l0;
		if(c == '\n') {
			*cp++ = 0;
			tp = hash(np);
			if(tp->name)
				goto redef;
			tp->name = np;
			tp->factor = lp->factor;
			for(c=0; c<NDIM; c++)
				tp->dim[c] = lp->dim[c];
			i++;
			goto l0;
		}
	}
	*cp++ = 0;
	lp = hash(np);
	if(lp->name)
		goto redef;
	convr((struct unit *)lp);
	lp->name = np;
	f = 0;
	i++;
	if(lp->factor != 1.0)
		goto l0;
	for(c=0; c<NDIM; c++) {
		t = lp->dim[c];
		if(t>1 || (f>0 && t!=0))
			goto l0;
		if(f==0 && t==1) {
			if(unames[c])
				goto l0;
			f = c+1;
		}
	}
	if(f>0)
		unames[f-1] = np;
	goto l0;

redef:
	printf("redefinition %s\n", np);
	goto l0;
}